

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

void __thiscall icu_63::TZEnumeration::TZEnumeration(TZEnumeration *this,TZEnumeration *other)

{
  int32_t *piVar1;
  TZEnumeration *other_local;
  TZEnumeration *this_local;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__TZEnumeration_004f95e0;
  this->map = (int32_t *)0x0;
  this->localMap = (int32_t *)0x0;
  this->len = 0;
  this->pos = 0;
  if (other->localMap == (int32_t *)0x0) {
    this->map = other->map;
    this->localMap = (int32_t *)0x0;
    this->len = other->len;
    this->pos = other->pos;
  }
  else {
    piVar1 = (int32_t *)uprv_malloc_63((long)other->len << 2);
    this->localMap = piVar1;
    if (this->localMap == (int32_t *)0x0) {
      this->len = 0;
      this->pos = 0;
      this->map = (int32_t *)0x0;
    }
    else {
      this->len = other->len;
      memcpy(this->localMap,other->localMap,(long)this->len << 2);
      this->pos = other->pos;
      this->map = this->localMap;
    }
  }
  return;
}

Assistant:

TZEnumeration(const TZEnumeration &other) : StringEnumeration(), map(NULL), localMap(NULL), len(0), pos(0) {
        if (other.localMap != NULL) {
            localMap = (int32_t *)uprv_malloc(other.len * sizeof(int32_t));
            if (localMap != NULL) {
                len = other.len;
                uprv_memcpy(localMap, other.localMap, len * sizeof(int32_t));
                pos = other.pos;
                map = localMap;
            } else {
                len = 0;
                pos = 0;
                map = NULL;
            }
        } else {
            map = other.map;
            localMap = NULL;
            len = other.len;
            pos = other.pos;
        }
    }